

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

player_race * get_player_race(void)

{
  byte bVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  int iVar4;
  bool bVar5;
  int iStack_1c;
  _Bool pick;
  wchar_t k;
  wchar_t i;
  player_race *p_race;
  
  _k = races;
  bVar1 = player->themed_level;
  wVar2 = themed_level_index("Estolad");
  if ((uint)bVar1 == wVar2) {
    uVar3 = Rand_div(2);
    bVar5 = uVar3 == 0;
    for (; _k != (player_race *)0x0; _k = _k->next) {
      iVar4 = strcmp(_k->hometown,"Ephel Brandir Town");
      if (iVar4 == 0) {
        if (bVar5) {
          return _k;
        }
        bVar5 = true;
      }
    }
  }
  uVar3 = Rand_div(race_prob[(int)(z_info->p_race_max - 1)][player->place]);
  iStack_1c = 0;
  while ((iStack_1c < (int)(uint)z_info->p_race_max &&
         (race_prob[iStack_1c][player->place] <= (int)uVar3))) {
    iStack_1c = iStack_1c + 1;
  }
  _k = races;
  for (; (_k != (player_race *)0x0 && (iStack_1c != 0)); iStack_1c = iStack_1c + -1) {
    _k = _k->next;
  }
  return _k;
}

Assistant:

struct player_race *get_player_race(void)
{
	struct player_race *p_race = races;
	int i, k;

	/* Special case -  Estolad themed level - Edain or Druedain */
	if (player->themed_level == themed_level_index("Estolad")) {
		/* Pick one of the races from Sphel Brandir */
		bool pick = (one_in_(2) ? true : false);
		while (p_race) {
			if (streq(p_race->hometown, "Ephel Brandir Town")) {
				if (pick) {
					return p_race;
				} else {
					pick = true;
				}
			}
			p_race = p_race->next;
		}
	}

	/* Pick one according to the probablilities */
	k = randint0(race_prob[z_info->p_race_max - 1][player->place]);
	for (i = 0; i < z_info->p_race_max; i++) {
		if (race_prob[i][player->place] > k) break;
	}

	/* Find the actual race */
	for (p_race = races; p_race; p_race = p_race->next) {
		if (i == 0) break;
		i--;
	}
	return p_race;
}